

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerSetPagesize(Pager *pPager,u32 *pPageSize,int nReserve)

{
  int iVar1;
  int in_EDX;
  uint *in_RSI;
  long in_RDI;
  i64 nByte;
  char *pNew;
  u32 pageSize;
  int rc;
  i64 *in_stack_ffffffffffffffc8;
  Pager *in_stack_ffffffffffffffd0;
  void *local_28;
  uint szPage;
  int iVar2;
  
  iVar2 = 0;
  szPage = *in_RSI;
  if ((((*(char *)(in_RDI + 0x13) == '\0') || (*(int *)(in_RDI + 0x1c) == 0)) &&
      (iVar1 = sqlite3PcacheRefCount(*(PCache **)(in_RDI + 0x118)), iVar1 == 0)) &&
     ((szPage != 0 && (szPage != *(uint *)(in_RDI + 0xbc))))) {
    local_28 = (void *)0x0;
    in_stack_ffffffffffffffd0 = (Pager *)0x0;
    if ((*(char *)(in_RDI + 0x14) != '\0') && (**(long **)(in_RDI + 0x48) != 0)) {
      iVar2 = sqlite3OsFileSize((sqlite3_file *)0x0,in_stack_ffffffffffffffc8);
    }
    if ((iVar2 == 0) && (local_28 = sqlite3PageMalloc(0), local_28 == (void *)0x0)) {
      iVar2 = 7;
    }
    if (iVar2 == 0) {
      pager_reset((Pager *)0x14521a);
      iVar2 = sqlite3PcacheSetPageSize((PCache *)CONCAT44(in_EDX,iVar2),szPage);
    }
    if (iVar2 == 0) {
      sqlite3PageFree((void *)0x14524b);
      *(void **)(in_RDI + 0x110) = local_28;
      *(int *)(in_RDI + 0x1c) =
           (int)((long)((long)in_stack_ffffffffffffffd0 + ((ulong)szPage - 1)) / (long)(ulong)szPage
                );
      *(uint *)(in_RDI + 0xbc) = szPage;
    }
    else {
      sqlite3PageFree((void *)0x14529a);
    }
  }
  *in_RSI = *(uint *)(in_RDI + 0xbc);
  if (iVar2 == 0) {
    if (in_EDX < 0) {
      in_EDX = (int)*(short *)(in_RDI + 0xb2);
    }
    *(short *)(in_RDI + 0xb2) = (short)in_EDX;
    pagerFixMaplimit(in_stack_ffffffffffffffd0);
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSetPagesize(Pager *pPager, u32 *pPageSize, int nReserve){
  int rc = SQLITE_OK;

  /* It is not possible to do a full assert_pager_state() here, as this
  ** function may be called from within PagerOpen(), before the state
  ** of the Pager object is internally consistent.
  **
  ** At one point this function returned an error if the pager was in 
  ** PAGER_ERROR state. But since PAGER_ERROR state guarantees that
  ** there is at least one outstanding page reference, this function
  ** is a no-op for that case anyhow.
  */

  u32 pageSize = *pPageSize;
  assert( pageSize==0 || (pageSize>=512 && pageSize<=SQLITE_MAX_PAGE_SIZE) );
  if( (pPager->memDb==0 || pPager->dbSize==0)
   && sqlite3PcacheRefCount(pPager->pPCache)==0 
   && pageSize && pageSize!=(u32)pPager->pageSize 
  ){
    char *pNew = NULL;             /* New temp space */
    i64 nByte = 0;

    if( pPager->eState>PAGER_OPEN && isOpen(pPager->fd) ){
      rc = sqlite3OsFileSize(pPager->fd, &nByte);
    }
    if( rc==SQLITE_OK ){
      pNew = (char *)sqlite3PageMalloc(pageSize);
      if( !pNew ) rc = SQLITE_NOMEM_BKPT;
    }

    if( rc==SQLITE_OK ){
      pager_reset(pPager);
      rc = sqlite3PcacheSetPageSize(pPager->pPCache, pageSize);
    }
    if( rc==SQLITE_OK ){
      sqlite3PageFree(pPager->pTmpSpace);
      pPager->pTmpSpace = pNew;
      pPager->dbSize = (Pgno)((nByte+pageSize-1)/pageSize);
      pPager->pageSize = pageSize;
    }else{
      sqlite3PageFree(pNew);
    }
  }

  *pPageSize = pPager->pageSize;
  if( rc==SQLITE_OK ){
    if( nReserve<0 ) nReserve = pPager->nReserve;
    assert( nReserve>=0 && nReserve<1000 );
    pPager->nReserve = (i16)nReserve;
    pagerReportSize(pPager);
    pagerFixMaplimit(pPager);
  }
  return rc;
}